

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O0

void __thiscall wasm::MinifiedPrinter::run(MinifiedPrinter *this,Module *module)

{
  PassOptions *pPVar1;
  undefined1 local_1a0 [8];
  PrintSExpression print;
  Module *module_local;
  MinifiedPrinter *this_local;
  
  print.typePrinter.fallbackNames._M_h._M_single_bucket = (__node_base_ptr)module;
  PrintSExpression::PrintSExpression((PrintSExpression *)local_1a0,(this->super_Printer).o);
  PrintSExpression::setMinify((PrintSExpression *)local_1a0,true);
  pPVar1 = Pass::getPassOptions((Pass *)this);
  PrintSExpression::setDebugInfo((PrintSExpression *)local_1a0,(bool)(pPVar1->debugInfo & 1));
  PrintSExpression::visitModule
            ((PrintSExpression *)local_1a0,
             (Module *)print.typePrinter.fallbackNames._M_h._M_single_bucket);
  PrintSExpression::~PrintSExpression((PrintSExpression *)local_1a0);
  return;
}

Assistant:

void run(Module* module) override {
    PrintSExpression print(o);
    print.setMinify(true);
    print.setDebugInfo(getPassOptions().debugInfo);
    print.visitModule(module);
  }